

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_listener.cpp
# Opt level: O3

int __thiscall
zmq::ipc_listener_t::accept(ipc_listener_t *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 in_RAX;
  uint *puVar4;
  socklen_t *extraout_RDX;
  socklen_t *__addr_len_00;
  socklen_t *extraout_RDX_00;
  uint uVar5;
  uint __fd_00;
  int local_14;
  
  local_14 = (this->super_stream_listener_base_t)._s;
  if (local_14 == -1) {
    local_14 = (int)((ulong)in_RAX >> 0x20);
    accept((int)this + 0x578,(sockaddr *)&local_14,(socklen_t *)__addr);
  }
  iVar2 = accept4(local_14,(sockaddr *)0x0,(socklen_t *)0x0,0x80000);
  if (iVar2 == -1) {
    puVar4 = (uint *)__errno_location();
    __fd_00 = *puVar4;
    if ((__fd_00 < 0x18) && ((0x800810U >> (__fd_00 & 0x1f) & 1) != 0)) {
      return -1;
    }
    if (__fd_00 == 0x47) {
      return -1;
    }
    if (__fd_00 == 0x67) {
      return -1;
    }
    uVar5 = 0x147;
    __addr_len_00 = extraout_RDX;
  }
  else {
    make_socket_noninheritable(iVar2);
    bVar1 = filter(this,iVar2);
    if (bVar1) {
      iVar3 = set_nosigpipe(iVar2);
      if (iVar3 == 0) {
        return iVar2;
      }
      iVar2 = ::close(iVar2);
      if (iVar2 == 0) {
        return -1;
      }
      uVar5 = 0x15d;
    }
    else {
      iVar2 = ::close(iVar2);
      if (iVar2 == 0) {
        return -1;
      }
      uVar5 = 0x152;
    }
    puVar4 = (uint *)__errno_location();
    __fd_00 = *puVar4;
    __addr_len_00 = extraout_RDX_00;
  }
  accept(__fd_00,(sockaddr *)(ulong)uVar5,__addr_len_00);
  return -1;
}

Assistant:

zmq::fd_t zmq::ipc_listener_t::accept ()
{
    //  Accept one connection and deal with different failure modes.
    //  The situation where connection cannot be accepted due to insufficient
    //  resources is considered valid and treated by ignoring the connection.
    zmq_assert (_s != retired_fd);
#if defined ZMQ_HAVE_SOCK_CLOEXEC && defined HAVE_ACCEPT4
    fd_t sock = ::accept4 (_s, NULL, NULL, SOCK_CLOEXEC);
#else
    struct sockaddr_storage ss;
    memset (&ss, 0, sizeof (ss));
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int ss_len = sizeof (ss);
#else
    socklen_t ss_len = sizeof (ss);
#endif

    const fd_t sock =
      ::accept (_s, reinterpret_cast<struct sockaddr *> (&ss), &ss_len);
#endif
    if (sock == retired_fd) {
#if defined ZMQ_HAVE_WINDOWS
        const int last_error = WSAGetLastError ();
        wsa_assert (last_error == WSAEWOULDBLOCK || last_error == WSAECONNRESET
                    || last_error == WSAEMFILE || last_error == WSAENOBUFS);
#else
        errno_assert (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR
                      || errno == ECONNABORTED || errno == EPROTO
                      || errno == ENFILE);
#endif
        return retired_fd;
    }

    make_socket_noninheritable (sock);

    // IPC accept() filters
#if defined ZMQ_HAVE_SO_PEERCRED || defined ZMQ_HAVE_LOCAL_PEERCRED
    if (!filter (sock)) {
        int rc = ::close (sock);
        errno_assert (rc == 0);
        return retired_fd;
    }
#endif

    if (zmq::set_nosigpipe (sock)) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (sock);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = ::close (sock);
        errno_assert (rc == 0);
#endif
        return retired_fd;
    }

    return sock;
}